

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,unsigned_long,duckdb::EntropyFunction<duckdb::ModeStandard<unsigned_long>>>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  data_ptr_t pdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  idx_t iVar5;
  unsigned_long uVar6;
  unsigned_long *puVar7;
  ulong uVar8;
  AggregateUnaryInput input_data;
  UnifiedVectorFormat sdata;
  unsigned_long *local_f0;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar7 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar7 == (unsigned_long *)0x0) || ((*puVar7 & 1) != 0)) {
      local_c0.data = (data_ptr_t)&input->validity;
      local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)0x0;
      local_c0.sel = (SelectionVector *)aggr_input_data;
      TypedModeFunction<duckdb::ModeStandard<unsigned_long>>::
      ConstantOperation<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::EntropyFunction<duckdb::ModeStandard<unsigned_long>>>
                (*(ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> **)states->data,
                 (unsigned_long *)input->data,(AggregateUnaryInput *)&local_c0,count);
    }
  }
  else if (input->vector_type == FLAT_VECTOR && states->vector_type == FLAT_VECTOR) {
    local_f0 = (unsigned_long *)input->data;
    pdVar1 = states->data;
    FlatVector::VerifyFlatVector(input);
    if ((input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        iVar5 = 0;
        do {
          BaseModeFunction<duckdb::ModeStandard<unsigned_long>>::
          Execute<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::EntropyFunction<duckdb::ModeStandard<unsigned_long>>>
                    (*(ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> **)
                      (pdVar1 + iVar5 * 8),local_f0,aggr_input_data);
          iVar5 = iVar5 + 1;
          local_f0 = local_f0 + 1;
        } while (count != iVar5);
      }
    }
    else if (0x3f < count + 0x3f) {
      uVar2 = 0;
      uVar4 = 0;
      do {
        puVar7 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar7 == (unsigned_long *)0x0) {
          uVar6 = 0xffffffffffffffff;
        }
        else {
          uVar6 = puVar7[uVar2];
        }
        uVar3 = uVar4 + 0x40;
        if (count <= uVar4 + 0x40) {
          uVar3 = count;
        }
        uVar8 = uVar3;
        if (uVar6 != 0) {
          uVar8 = uVar4;
          if (uVar6 == 0xffffffffffffffff) {
            if (uVar4 < uVar3) {
              puVar7 = local_f0 + uVar4;
              do {
                BaseModeFunction<duckdb::ModeStandard<unsigned_long>>::
                Execute<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::EntropyFunction<duckdb::ModeStandard<unsigned_long>>>
                          (*(ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> **)
                            (pdVar1 + uVar4 * 8),puVar7,aggr_input_data);
                uVar4 = uVar4 + 1;
                puVar7 = puVar7 + 1;
                uVar8 = uVar4;
              } while (uVar3 != uVar4);
            }
          }
          else if (uVar4 < uVar3) {
            puVar7 = local_f0 + uVar4;
            uVar8 = 0;
            do {
              if ((uVar6 >> (uVar8 & 0x3f) & 1) != 0) {
                BaseModeFunction<duckdb::ModeStandard<unsigned_long>>::
                Execute<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::EntropyFunction<duckdb::ModeStandard<unsigned_long>>>
                          (*(ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> **)
                            (pdVar1 + uVar8 * 8 + uVar4 * 8),puVar7,aggr_input_data);
              }
              uVar8 = uVar8 + 1;
              puVar7 = puVar7 + 1;
            } while ((uVar4 - uVar3) + uVar8 != 0);
            uVar8 = uVar4 + uVar8;
          }
        }
        uVar2 = uVar2 + 1;
        uVar4 = uVar8;
      } while (uVar2 != count + 0x3f >> 6);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_c0);
    Vector::ToUnifiedFormat(states,count,&local_78);
    if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        uVar4 = 0;
        do {
          uVar2 = uVar4;
          if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
            uVar2 = (ulong)(local_c0.sel)->sel_vector[uVar4];
          }
          uVar3 = uVar4;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            uVar3 = (ulong)(local_78.sel)->sel_vector[uVar4];
          }
          BaseModeFunction<duckdb::ModeStandard<unsigned_long>>::
          Execute<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::EntropyFunction<duckdb::ModeStandard<unsigned_long>>>
                    (*(ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> **)
                      (local_78.data + uVar3 * 8),(unsigned_long *)(local_c0.data + uVar2 * 8),
                     aggr_input_data);
          uVar4 = uVar4 + 1;
        } while (count != uVar4);
      }
    }
    else if (count != 0) {
      uVar4 = 0;
      do {
        uVar2 = uVar4;
        if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
          uVar2 = (ulong)(local_c0.sel)->sel_vector[uVar4];
        }
        uVar3 = uVar4;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar3 = (ulong)(local_78.sel)->sel_vector[uVar4];
        }
        if ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar2 >> 6]
             >> (uVar2 & 0x3f) & 1) != 0)) {
          BaseModeFunction<duckdb::ModeStandard<unsigned_long>>::
          Execute<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::EntropyFunction<duckdb::ModeStandard<unsigned_long>>>
                    (*(ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> **)
                      (local_78.data + uVar3 * 8),(unsigned_long *)(local_c0.data + uVar2 * 8),
                     aggr_input_data);
        }
        uVar4 = uVar4 + 1;
      } while (count != uVar4);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_c0.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}